

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ellswift_xswiftec_inv_var(secp256k1_fe *t,secp256k1_fe *x_in,secp256k1_fe *u_in,int c)

{
  int iVar1;
  secp256k1_fe *b;
  uint64_t uVar2;
  secp256k1_fe local_1b8;
  secp256k1_fe *local_190;
  secp256k1_fe x;
  secp256k1_fe local_158;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  uint64_t local_c8;
  uint64_t uStack_c0;
  uint64_t local_b8;
  uint64_t uStack_b0;
  secp256k1_fe r;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  x.n[4] = x_in->n[4];
  x.n[0] = x_in->n[0];
  x.n[1] = x_in->n[1];
  x.n[2] = x_in->n[2];
  x.n[3] = x_in->n[3];
  local_158.n[4] = u_in->n[4];
  local_158.n[0] = u_in->n[0];
  local_158.n[1] = u_in->n[1];
  local_158.n[2] = u_in->n[2];
  local_158.n[3] = u_in->n[3];
  secp256k1_fe_impl_normalize_weak(&x);
  secp256k1_fe_impl_normalize_weak(&local_158);
  local_190 = t;
  if ((c & 2U) == 0) {
    local_1b8.n[0] = 0x5ffff9ffffe91a - (x.n[0] + local_158.n[0]);
    local_1b8.n[1] = 0x5ffffffffffffa - (x.n[1] + local_158.n[1]);
    local_1b8.n[2] = 0x5ffffffffffffa - (x.n[2] + local_158.n[2]);
    local_1b8.n[3] = 0x5ffffffffffffa - (x.n[3] + local_158.n[3]);
    local_1b8.n[4] = 0x5fffffffffffa - (x.n[4] + local_158.n[4]);
    iVar1 = secp256k1_ge_x_on_curve_var(&local_1b8);
    if (iVar1 != 0) {
      return 0;
    }
    secp256k1_fe_impl_sqr(&local_128,&local_1b8);
    secp256k1_fe_impl_mul(&local_1b8,&local_158,&x);
    local_128.n[0] = (local_1b8.n[0] - local_128.n[0]) + 0x3ffffbfffff0bc;
    local_128.n[1] = (local_1b8.n[1] - local_128.n[1]) + 0x3ffffffffffffc;
    local_128.n[2] = (local_1b8.n[2] - local_128.n[2]) + 0x3ffffffffffffc;
    local_128.n[3] = (local_1b8.n[3] - local_128.n[3]) + 0x3ffffffffffffc;
    local_128.n[4] = (local_1b8.n[4] - local_128.n[4]) + 0x3fffffffffffc;
    secp256k1_fe_impl_sqr(&local_80,&local_158);
    secp256k1_fe_impl_mul(&local_80,&local_80,&local_158);
    local_80.n[0] = local_80.n[0] + 7;
    secp256k1_fe_impl_mul(&local_1b8,&local_128,&local_80);
    iVar1 = secp256k1_fe_impl_is_square_var(&local_1b8);
    if (iVar1 == 0) {
      return 0;
    }
    secp256k1_fe_impl_inv_var(&local_128,&local_128);
    secp256k1_fe_impl_mul(&local_128,&local_128,&local_80);
    local_f8.n[4] = x.n[4];
    local_f8.n[2] = x.n[2];
    local_f8.n[3] = x.n[3];
    local_f8.n[0] = x.n[0];
    local_f8.n[1] = x.n[1];
  }
  else {
    local_1b8.n[0] = 0x3ffffbfffff0bc - local_158.n[0];
    local_1b8.n[1] = 0x3ffffffffffffc - local_158.n[1];
    local_1b8.n[2] = 0x3ffffffffffffc - local_158.n[2];
    local_1b8.n[3] = 0x3ffffffffffffc - local_158.n[3];
    uVar2 = 0x3fffffffffffc - local_158.n[4];
    local_128.n[0] = local_1b8.n[0] + x.n[0];
    local_128.n[1] = local_1b8.n[1] + x.n[1];
    local_128.n[2] = local_1b8.n[2] + x.n[2];
    local_128.n[3] = local_1b8.n[3] + x.n[3];
    local_128.n[4] = x.n[4] + uVar2;
    local_1b8.n[4] = uVar2;
    local_c8 = local_1b8.n[2];
    uStack_c0 = local_1b8.n[3];
    local_b8 = local_1b8.n[0];
    uStack_b0 = local_1b8.n[1];
    iVar1 = secp256k1_fe_impl_is_square_var(&local_128);
    if (iVar1 == 0) {
      return 0;
    }
    secp256k1_fe_impl_sqr(&local_80,&local_158);
    secp256k1_fe_impl_mul(&local_58,&local_128,&local_80);
    secp256k1_fe_impl_mul(&local_80,&local_80,&local_158);
    local_58.n[0] = local_58.n[0] * 3 + local_80.n[0] * 4 + 0x1c;
    local_58.n[1] = local_80.n[1] * 4 + local_58.n[1] * 3;
    local_58.n[2] = local_80.n[2] * 4 + local_58.n[2] * 3;
    local_58.n[3] = local_80.n[3] * 4 + local_58.n[3] * 3;
    local_58.n[4] = local_80.n[4] * 4 + local_58.n[4] * 3;
    secp256k1_fe_impl_mul(&local_58,&local_58,&local_128);
    local_58.n[0] = 0x3ffffbfffff0bc - local_58.n[0];
    local_58.n[1] = 0x3ffffffffffffc - local_58.n[1];
    local_58.n[2] = 0x3ffffffffffffc - local_58.n[2];
    local_58.n[3] = 0x3ffffffffffffc - local_58.n[3];
    local_58.n[4] = 0x3fffffffffffc - local_58.n[4];
    iVar1 = secp256k1_fe_impl_is_square_var(&local_58);
    if (iVar1 == 0) {
      return 0;
    }
    secp256k1_fe_sqrt(&r,&local_58);
    if (((c & 1U) != 0) && (iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&r), iVar1 != 0)) {
      return 0;
    }
    iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_128);
    if (iVar1 != 0) {
      return 0;
    }
    secp256k1_fe_impl_inv_var(&local_f8,&local_128);
    secp256k1_fe_impl_mul(&local_f8,&local_f8,&r);
    local_f8.n[0] = local_b8 + local_f8.n[0];
    local_f8.n[1] = uStack_b0 + local_f8.n[1];
    local_f8.n[2] = local_c8 + local_f8.n[2];
    local_f8.n[3] = uStack_c0 + local_f8.n[3];
    local_f8.n[4] = local_f8.n[4] + uVar2;
    secp256k1_fe_impl_half(&local_f8);
  }
  secp256k1_fe_sqrt(&local_1b8,&local_128);
  if (((c & 5U) == 5) || ((c & 5U) == 0)) {
    local_1b8.n[0] = 0x3ffffbfffff0bc - local_1b8.n[0];
    local_1b8.n[1] = 0x3ffffffffffffc - local_1b8.n[1];
    local_1b8.n[2] = 0x3ffffffffffffc - local_1b8.n[2];
    local_1b8.n[3] = 0x3ffffffffffffc - local_1b8.n[3];
    local_1b8.n[4] = 0x3fffffffffffc - local_1b8.n[4];
  }
  b = &secp256k1_ellswift_c4;
  if ((c & 1U) == 0) {
    b = &secp256k1_ellswift_c3;
  }
  secp256k1_fe_impl_mul(&local_158,&local_158,b);
  local_158.n[0] = local_158.n[0] + local_f8.n[0];
  local_158.n[1] = local_158.n[1] + local_f8.n[1];
  local_158.n[2] = local_158.n[2] + local_f8.n[2];
  local_158.n[3] = local_158.n[3] + local_f8.n[3];
  local_158.n[4] = local_158.n[4] + local_f8.n[4];
  secp256k1_fe_impl_mul(local_190,&local_1b8,&local_158);
  return 1;
}

Assistant:

static int secp256k1_ellswift_xswiftec_inv_var(secp256k1_fe *t, const secp256k1_fe *x_in, const secp256k1_fe *u_in, int c) {
    /* The implemented algorithm is this (all arithmetic, except involving c, is mod p):
     *
     * - If (c & 2) = 0:
     *   - If (-x-u) is a valid X coordinate, fail.
     *   - Let s=-(u^3+7)/(u^2+u*x+x^2).
     *   - If s is not square, fail.
     *   - Let v=x.
     * - If (c & 2) = 2:
     *   - Let s=x-u.
     *   - If s is not square, fail.
     *   - Let r=sqrt(-s*(4*(u^3+7)+3*u^2*s)); fail if it doesn't exist.
     *   - If (c & 1) = 1 and r = 0, fail.
     *   - If s=0, fail.
     *   - Let v=(r/s-u)/2.
     * - Let w=sqrt(s).
     * - If (c & 5) = 0: return -w*(c3*u + v).
     * - If (c & 5) = 1: return  w*(c4*u + v).
     * - If (c & 5) = 4: return  w*(c3*u + v).
     * - If (c & 5) = 5: return -w*(c4*u + v).
     */
    secp256k1_fe x = *x_in, u = *u_in, g, v, s, m, r, q;
    int ret;

    secp256k1_fe_normalize_weak(&x);
    secp256k1_fe_normalize_weak(&u);

    VERIFY_CHECK(c >= 0 && c < 8);
    VERIFY_CHECK(secp256k1_ge_x_on_curve_var(&x));

    if (!(c & 2)) {
        /* c is in {0, 1, 4, 5}. In this case we look for an inverse under the x1 (if c=0 or
         * c=4) formula, or x2 (if c=1 or c=5) formula. */

        /* If -u-x is a valid X coordinate, fail. This would yield an encoding that roundtrips
         * back under the x3 formula instead (which has priority over x1 and x2, so the decoding
         * would not match x). */
        m = x;                                          /* m = x */
        secp256k1_fe_add(&m, &u);                       /* m = u+x */
        secp256k1_fe_negate(&m, &m, 2);                 /* m = -u-x */
        /* Test if (-u-x) is a valid X coordinate. If so, fail. */
        if (secp256k1_ge_x_on_curve_var(&m)) return 0;

        /* Let s = -(u^3 + 7)/(u^2 + u*x + x^2) [first part] */
        secp256k1_fe_sqr(&s, &m);                       /* s = (u+x)^2 */
        secp256k1_fe_negate(&s, &s, 1);                 /* s = -(u+x)^2 */
        secp256k1_fe_mul(&m, &u, &x);                   /* m = u*x */
        secp256k1_fe_add(&s, &m);                       /* s = -(u^2 + u*x + x^2) */

        /* Note that at this point, s = 0 is impossible. If it were the case:
         *             s = -(u^2 + u*x + x^2) = 0
         * =>                 u^2 + u*x + x^2 = 0
         * =>   (u + 2*x) * (u^2 + u*x + x^2) = 0
         * => 2*x^3 + 3*x^2*u + 3*x*u^2 + u^3 = 0
         * =>                 (x + u)^3 + x^3 = 0
         * =>                             x^3 = -(x + u)^3
         * =>                         x^3 + B = (-u - x)^3 + B
         *
         * However, we know x^3 + B is square (because x is on the curve) and
         * that (-u-x)^3 + B is not square (the secp256k1_ge_x_on_curve_var(&m)
         * test above would have failed). This is a contradiction, and thus the
         * assumption s=0 is false. */
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(&s));

        /* If s is not square, fail. We have not fully computed s yet, but s is square iff
         * -(u^3+7)*(u^2+u*x+x^2) is square (because a/b is square iff a*b is square and b is
         * nonzero). */
        secp256k1_fe_sqr(&g, &u);                       /* g = u^2 */
        secp256k1_fe_mul(&g, &g, &u);                   /* g = u^3 */
        secp256k1_fe_add_int(&g, SECP256K1_B);          /* g = u^3+7 */
        secp256k1_fe_mul(&m, &s, &g);                   /* m = -(u^3 + 7)*(u^2 + u*x + x^2) */
        if (!secp256k1_fe_is_square_var(&m)) return 0;

        /* Let s = -(u^3 + 7)/(u^2 + u*x + x^2) [second part] */
        secp256k1_fe_inv_var(&s, &s);                   /* s = -1/(u^2 + u*x + x^2) [no div by 0] */
        secp256k1_fe_mul(&s, &s, &g);                   /* s = -(u^3 + 7)/(u^2 + u*x + x^2) */

        /* Let v = x. */
        v = x;
    } else {
        /* c is in {2, 3, 6, 7}. In this case we look for an inverse under the x3 formula. */

        /* Let s = x-u. */
        secp256k1_fe_negate(&m, &u, 1);                 /* m = -u */
        s = m;                                          /* s = -u */
        secp256k1_fe_add(&s, &x);                       /* s = x-u */

        /* If s is not square, fail. */
        if (!secp256k1_fe_is_square_var(&s)) return 0;

        /* Let r = sqrt(-s*(4*(u^3+7)+3*u^2*s)); fail if it doesn't exist. */
        secp256k1_fe_sqr(&g, &u);                       /* g = u^2 */
        secp256k1_fe_mul(&q, &s, &g);                   /* q = s*u^2 */
        secp256k1_fe_mul_int(&q, 3);                    /* q = 3*s*u^2 */
        secp256k1_fe_mul(&g, &g, &u);                   /* g = u^3 */
        secp256k1_fe_mul_int(&g, 4);                    /* g = 4*u^3 */
        secp256k1_fe_add_int(&g, 4 * SECP256K1_B);      /* g = 4*(u^3+7) */
        secp256k1_fe_add(&q, &g);                       /* q = 4*(u^3+7)+3*s*u^2 */
        secp256k1_fe_mul(&q, &q, &s);                   /* q = s*(4*(u^3+7)+3*u^2*s) */
        secp256k1_fe_negate(&q, &q, 1);                 /* q = -s*(4*(u^3+7)+3*u^2*s) */
        if (!secp256k1_fe_is_square_var(&q)) return 0;
        ret = secp256k1_fe_sqrt(&r, &q);                /* r = sqrt(-s*(4*(u^3+7)+3*u^2*s)) */
#ifdef VERIFY
        VERIFY_CHECK(ret);
#else
        (void)ret;
#endif

        /* If (c & 1) = 1 and r = 0, fail. */
        if (EXPECT((c & 1) && secp256k1_fe_normalizes_to_zero_var(&r), 0)) return 0;

        /* If s = 0, fail. */
        if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&s), 0)) return 0;

        /* Let v = (r/s-u)/2. */
        secp256k1_fe_inv_var(&v, &s);                   /* v = 1/s [no div by 0] */
        secp256k1_fe_mul(&v, &v, &r);                   /* v = r/s */
        secp256k1_fe_add(&v, &m);                       /* v = r/s-u */
        secp256k1_fe_half(&v);                          /* v = (r/s-u)/2 */
    }

    /* Let w = sqrt(s). */
    ret = secp256k1_fe_sqrt(&m, &s);                    /* m = sqrt(s) = w */
    VERIFY_CHECK(ret);

    /* Return logic. */
    if ((c & 5) == 0 || (c & 5) == 5) {
        secp256k1_fe_negate(&m, &m, 1);                 /* m = -w */
    }
    /* Now m = {-w if c&5=0 or c&5=5; w otherwise}. */
    secp256k1_fe_mul(&u, &u, c&1 ? &secp256k1_ellswift_c4 : &secp256k1_ellswift_c3);
    /* u = {c4 if c&1=1; c3 otherwise}*u */
    secp256k1_fe_add(&u, &v);                           /* u = {c4 if c&1=1; c3 otherwise}*u + v */
    secp256k1_fe_mul(t, &m, &u);
    return 1;
}